

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_fold2_key.c
# Opt level: O2

int onigenc_unicode_fold2_key(OnigCodePoint *codes)

{
  byte bVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = onig_codes_byte_at(codes,5);
  bVar1 = hash_asso_values[uVar3 & 0xff];
  uVar3 = onig_codes_byte_at(codes,2);
  if ((uint)(byte)hash_asso_values[uVar3 & 0xff] + (uint)bVar1 < 0x3b) {
    sVar2 = onigenc_unicode_fold2_key::wordlist
            [(uint)(byte)hash_asso_values[uVar3 & 0xff] + (uint)bVar1];
    iVar4 = onig_codes_cmp(codes,OnigUnicodeFolds2 + (uint)(int)sVar2,2);
    uVar3 = -(uint)(iVar4 != 0) | (int)sVar2;
  }
  else {
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

int
onigenc_unicode_fold2_key(OnigCodePoint codes[])
{
  static const short int wordlist[] =
    {

      101,

      253,

      76,

      29,

      24,

      239,

      96,

      71,

      92,

      67,

      4,

      62,

      8,

      58,

      234,

      109,

      164,

      88,

      84,

      80,

      214,

      0,

      54,

      261,

      50,

      105,

      121,

      125,

      257,

      42,

      38,

      249,

      46,

      117,

      12,

      113,

      244,

      229,

      224,

      219,

      209,

      16,

      204,

      199,

      194,

      189,

      184,

      179,

      174,

      169,

      20,

      34,

      159,

      154,

      149,

      144,

      139,

      134,

      129
    };


    {
      int key = hash(codes);

      if (key <= MAX_HASH_VALUE)
        {
          int index = wordlist[key];

          if (index >= 0 && onig_codes_cmp(codes, OnigUnicodeFolds2 + index, 2) == 0)
            return index;
        }
    }
  return -1;
}